

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketOnline.cpp
# Opt level: O0

void __thiscall SocketOnline::recv_message(SocketOnline *this,Mat *a)

{
  SocketOnline *in_RSI;
  char *in_RDI;
  char *p;
  char **in_stack_00000038;
  Mat *in_stack_00000040;
  undefined8 in_stack_ffffffffffffffd8;
  int l;
  undefined8 in_stack_ffffffffffffffe8;
  SOCK sock;
  
  sock = (SOCK)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  recv_message_n(in_RSI,sock,in_RDI,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  l = (int)((ulong)*(undefined8 *)(in_RDI + 8) >> 0x20);
  Mat::getStringLen((Mat *)in_RSI);
  recv_message_n(in_RSI,sock,in_RDI,l);
  Mat::addFrom_pos(in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

void SocketOnline::recv_message(Mat *a) {
    recv_message_n(sock, header, HEADER_LEN);
    recv_message_n(sock, buffer, a->getStringLen());
    char* p = buffer;
    a->addFrom_pos(p);
//    cout << "--------------" << endl;
}